

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.h
# Opt level: O1

void __thiscall LogFile::~LogFile(LogFile *this)

{
  pointer pcVar1;
  
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::~unique_ptr(&this->file_);
  std::unique_ptr<MutexLock,_std::default_delete<MutexLock>_>::~unique_ptr(&this->mutex_);
  pcVar1 = (this->basename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->basename_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~LogFile() = default;